

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.hpp
# Opt level: O1

void __thiscall
optimization::sanity_check::SanityCheck::optimize_func(SanityCheck *this,MirFunction *func)

{
  long *plVar1;
  undefined **ppuVar2;
  long lVar3;
  _func_int **pp_Var4;
  _Base_ptr p_Var5;
  variant_alternative_t<0UL,_variant<VarId,_basic_string<char>_>_> *pvVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  _Rb_tree_color bb;
  _Base_ptr p_Var9;
  long lVar10;
  anon_class_8_1_898bcfc2 check;
  Value v;
  anon_class_8_1_898bcfc2 local_268;
  _func_int **local_260;
  undefined1 local_258 [24];
  char local_240;
  undefined2 local_23f;
  _Base_ptr local_238;
  VarId local_230;
  undefined **local_220;
  undefined **local_218;
  undefined **local_210;
  undefined **local_208;
  _Base_ptr local_200;
  undefined **local_1f8;
  undefined **local_1f0;
  undefined **local_1e8;
  undefined **local_1e0;
  undefined **local_1d8;
  undefined **local_1d0;
  _Base_ptr local_1c8;
  _Base_ptr local_1c0;
  long local_1b8;
  _func_int **local_1b0;
  _func_int *local_1a8;
  uint32_t local_1a0;
  char local_198;
  undefined2 local_197;
  _func_int **local_190;
  _func_int *local_188;
  uint32_t local_180;
  char local_178;
  undefined2 local_177;
  _func_int **local_170;
  _func_int *local_168;
  uint32_t local_160;
  char local_158;
  undefined2 local_157;
  _func_int **local_150;
  _func_int *local_148;
  uint32_t local_140;
  char local_138;
  undefined2 local_137;
  _func_int **local_130;
  _func_int *local_128;
  uint32_t local_120;
  char local_118;
  undefined2 local_117;
  _func_int **local_110;
  _func_int *local_108;
  uint32_t local_100;
  char local_f8;
  undefined2 local_f7;
  _func_int **local_f0;
  _func_int *local_e8;
  uint32_t local_e0;
  char local_d8;
  undefined2 local_d7;
  _func_int **local_d0;
  _func_int *local_c8;
  uint32_t local_c0;
  char local_b8;
  undefined2 local_b7;
  _func_int **local_b0;
  _func_int *local_a8;
  uint32_t local_a0;
  char local_98;
  undefined2 local_97;
  _func_int **local_90;
  _func_int *local_88;
  uint32_t local_80;
  char local_78;
  undefined2 local_77;
  _func_int **local_70;
  _func_int *local_68;
  uint32_t local_60;
  char local_58;
  undefined2 local_57;
  VarId local_50;
  VarId local_40;
  
  local_238 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_200 = &(func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_238 != local_200) {
    local_1d0 = &PTR_display_001f0078;
    local_260 = (_func_int **)&PTR_display_001effc8;
    local_1d8 = &PTR_display_001f0138;
    local_1e0 = &PTR_display_001f0018;
    local_1e8 = &PTR_display_001f01f8;
    local_1f0 = &PTR_display_001f02b8;
    local_1f8 = &PTR_display_001f0258;
    local_208 = &PTR_display_001f0318;
    local_210 = &PTR_display_001f0198;
    local_218 = &PTR_display_001f03d8;
    local_220 = &PTR_display_001f0378;
    local_268.func = func;
    do {
      p_Var9 = local_238[3]._M_parent;
      local_1c8 = local_238[3]._M_left;
      if (p_Var9 != local_1c8) {
        do {
          p_Var5 = local_238;
          plVar1 = *(long **)p_Var9;
          local_40.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
          local_40.id = *(uint32_t *)(plVar1 + 2);
          optimize_func::anon_class_8_1_898bcfc2::operator()
                    (&local_268,&local_40,local_238[1]._M_color);
          ppuVar2 = (undefined **)*plVar1;
          local_1c0 = p_Var9;
          if (ppuVar2 == local_1d0) {
            local_58 = (char)plVar1[6];
            local_258._0_8_ = &local_68;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr[(long)local_58 + 1]._M_data)
                      ((anon_class_8_1_a78179b7_conflict *)local_258,
                       (variant<int,_mir::inst::VarId> *)(plVar1 + 4));
            local_70 = local_260;
            local_57 = *(undefined2 *)((long)plVar1 + 0x31);
            if (local_58 == '\x01') {
              local_258._0_8_ = &PTR_display_001ee058;
              local_258._8_4_ = local_60;
              optimize_func::anon_class_8_1_898bcfc2::operator()
                        (&local_268,(VarId *)local_258,p_Var5[1]._M_color);
            }
            local_78 = (char)plVar1[10];
            local_258._0_8_ = &local_88;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr[(long)local_78 + 1]._M_data)
                      ((anon_class_8_1_a78179b7_conflict *)local_258,
                       (variant<int,_mir::inst::VarId> *)(plVar1 + 8));
            local_90 = local_260;
            local_77 = *(undefined2 *)((long)plVar1 + 0x51);
            if (local_78 == '\x01') {
              bb = p_Var5[1]._M_color;
              local_258._8_4_ = local_80;
              goto LAB_0011d3fe;
            }
          }
          else if (ppuVar2 == local_1d8) {
            lVar10 = plVar1[7];
            local_1b8 = plVar1[8];
            if (lVar10 != local_1b8) {
              do {
                local_240 = *(char *)(lVar10 + 0x18);
                local_230.super_Displayable._vptr_Displayable = (_func_int **)(local_258 + 8);
                (*std::__detail::__variant::
                  __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                  ::_S_vtable._M_arr[(long)*(char *)(lVar10 + 0x18) + 1]._M_data)
                          ((anon_class_8_1_a78179b7_conflict *)&local_230,
                           (variant<int,_mir::inst::VarId> *)(lVar10 + 8));
                pp_Var4 = local_260;
                local_258._0_8_ = local_260;
                local_23f = *(undefined2 *)(lVar10 + 0x19);
                local_98 = local_240;
                local_230.super_Displayable._vptr_Displayable = &local_a8;
                (*std::__detail::__variant::
                  __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                  ::_S_vtable._M_arr[(long)local_240 + 1]._M_data)
                          ((anon_class_8_1_a78179b7_conflict *)&local_230,
                           (variant<int,_mir::inst::VarId> *)(local_258 + 8));
                local_b0 = pp_Var4;
                local_97 = local_23f;
                if (local_98 == '\x01') {
                  local_230.super_Displayable._vptr_Displayable =
                       (_func_int **)&PTR_display_001ee058;
                  local_230.id = local_a0;
                  optimize_func::anon_class_8_1_898bcfc2::operator()
                            (&local_268,&local_230,local_238[1]._M_color);
                }
                lVar10 = lVar10 + 0x20;
              } while (lVar10 != local_1b8);
            }
          }
          else if (ppuVar2 == local_1e0) {
            local_b8 = (char)plVar1[6];
            local_258._0_8_ = &local_c8;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr[(long)local_b8 + 1]._M_data)
                      ((anon_class_8_1_a78179b7_conflict *)local_258,
                       (variant<int,_mir::inst::VarId> *)(plVar1 + 4));
            local_d0 = local_260;
            local_b7 = *(undefined2 *)((long)plVar1 + 0x31);
            if (local_b8 == '\x01') {
              bb = p_Var5[1]._M_color;
              local_258._8_4_ = local_c0;
LAB_0011d3fe:
              local_258._0_8_ = &PTR_display_001ee058;
              optimize_func::anon_class_8_1_898bcfc2::operator()(&local_268,(VarId *)local_258,bb);
            }
          }
          else if (ppuVar2 == local_1e8) {
            local_d8 = (char)plVar1[6];
            local_258._0_8_ = &local_e8;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr[(long)local_d8 + 1]._M_data)
                      ((anon_class_8_1_a78179b7_conflict *)local_258,
                       (variant<int,_mir::inst::VarId> *)(plVar1 + 4));
            local_f0 = local_260;
            local_d7 = *(undefined2 *)((long)plVar1 + 0x31);
            if (local_d8 == '\x01') {
              bb = p_Var5[1]._M_color;
              local_258._8_4_ = local_e0;
              goto LAB_0011d3fe;
            }
          }
          else if (ppuVar2 == local_1f0) {
            local_f8 = (char)plVar1[6];
            local_258._0_8_ = &local_108;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr[(long)local_f8 + 1]._M_data)
                      ((anon_class_8_1_a78179b7_conflict *)local_258,
                       (variant<int,_mir::inst::VarId> *)(plVar1 + 4));
            local_110 = local_260;
            local_f7 = *(undefined2 *)((long)plVar1 + 0x31);
            if (local_f8 == '\x01') {
              bb = p_Var5[1]._M_color;
              local_258._8_4_ = local_100;
              goto LAB_0011d3fe;
            }
          }
          else if (plVar1 == (long *)0x0 || ppuVar2 != local_1f8) {
            if (plVar1 == (long *)0x0 || ppuVar2 != local_208) {
              if (plVar1 == (long *)0x0 || ppuVar2 != local_210) {
                if (plVar1 == (long *)0x0 || ppuVar2 != local_218) {
                  if ((plVar1 == (long *)0x0) || (ppuVar2 != local_220)) {
                    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
                    puVar8 = (undefined8 *)operator_new(8);
                    *puVar8 = std::__throw_invalid_argument;
                    *puVar7 = puVar8;
                    __cxa_throw(puVar7,&std::bad_cast*::typeinfo,0);
                  }
                  local_258._8_4_ = *(undefined4 *)(plVar1 + 4);
                  local_258._0_8_ = &PTR_display_001ee058;
                  optimize_func::anon_class_8_1_898bcfc2::operator()
                            (&local_268,(VarId *)local_258,p_Var5[1]._M_color);
                  local_198 = (char)plVar1[8];
                  local_258._0_8_ = &local_1a8;
                  (*std::__detail::__variant::
                    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                    ::_S_vtable._M_arr[(long)local_198 + 1]._M_data)
                            ((anon_class_8_1_a78179b7_conflict *)local_258,
                             (variant<int,_mir::inst::VarId> *)(plVar1 + 6));
                  local_1b0 = local_260;
                  local_197 = *(undefined2 *)((long)plVar1 + 0x41);
                  if (local_198 == '\x01') {
                    bb = p_Var5[1]._M_color;
                    local_258._8_4_ = local_1a0;
                    goto LAB_0011d3fe;
                  }
                }
                else {
                  lVar3 = plVar1[6];
                  for (lVar10 = plVar1[5]; lVar10 != lVar3; lVar10 = lVar10 + 0x10) {
                    local_50.id = *(uint32_t *)(lVar10 + 8);
                    local_50.super_Displayable._vptr_Displayable =
                         (_func_int **)&PTR_display_001ee058;
                    optimize_func::anon_class_8_1_898bcfc2::operator()
                              (&local_268,&local_50,local_238[1]._M_color);
                  }
                }
              }
              else if ((char)plVar1[7] == '\0') {
                pvVar6 = std::get<0ul,mir::inst::VarId,std::__cxx11::string>
                                   ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)(plVar1 + 3));
                local_258._8_4_ = pvVar6->id;
                bb = local_238[1]._M_color;
                goto LAB_0011d3fe;
              }
            }
            else {
              local_158 = (char)plVar1[6];
              local_258._0_8_ = &local_168;
              (*std::__detail::__variant::
                __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                ::_S_vtable._M_arr[(long)local_158 + 1]._M_data)
                        ((anon_class_8_1_a78179b7_conflict *)local_258,
                         (variant<int,_mir::inst::VarId> *)(plVar1 + 4));
              local_170 = local_260;
              local_157 = *(undefined2 *)((long)plVar1 + 0x31);
              if (local_158 == '\x01') {
                local_258._0_8_ = &PTR_display_001ee058;
                local_258._8_4_ = local_160;
                optimize_func::anon_class_8_1_898bcfc2::operator()
                          (&local_268,(VarId *)local_258,p_Var5[1]._M_color);
              }
              local_178 = (char)plVar1[10];
              local_258._0_8_ = &local_188;
              (*std::__detail::__variant::
                __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                ::_S_vtable._M_arr[(long)local_178 + 1]._M_data)
                        ((anon_class_8_1_a78179b7_conflict *)local_258,
                         (variant<int,_mir::inst::VarId> *)(plVar1 + 8));
              local_190 = local_260;
              local_177 = *(undefined2 *)((long)plVar1 + 0x51);
              if (local_178 == '\x01') {
                bb = p_Var5[1]._M_color;
                local_258._8_4_ = local_180;
                goto LAB_0011d3fe;
              }
            }
          }
          else {
            local_118 = (char)plVar1[6];
            local_258._0_8_ = &local_128;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr[(long)local_118 + 1]._M_data)
                      ((anon_class_8_1_a78179b7_conflict *)local_258,
                       (variant<int,_mir::inst::VarId> *)(plVar1 + 4));
            local_130 = local_260;
            local_117 = *(undefined2 *)((long)plVar1 + 0x31);
            if (local_118 == '\x01') {
              local_258._0_8_ = &PTR_display_001ee058;
              local_258._8_4_ = local_120;
              optimize_func::anon_class_8_1_898bcfc2::operator()
                        (&local_268,(VarId *)local_258,p_Var5[1]._M_color);
            }
            local_138 = (char)plVar1[10];
            local_258._0_8_ = &local_148;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr[(long)local_138 + 1]._M_data)
                      ((anon_class_8_1_a78179b7_conflict *)local_258,
                       (variant<int,_mir::inst::VarId> *)(plVar1 + 8));
            local_150 = local_260;
            local_137 = *(undefined2 *)((long)plVar1 + 0x51);
            if (local_138 == '\x01') {
              bb = p_Var5[1]._M_color;
              local_258._8_4_ = local_140;
              goto LAB_0011d3fe;
            }
          }
          p_Var9 = (_Base_ptr)&local_1c0->_M_parent;
        } while (p_Var9 != local_1c8);
      }
      local_238 = (_Base_ptr)std::_Rb_tree_increment(local_238);
    } while (local_238 != local_200);
  }
  return;
}

Assistant:

void optimize_func(mir::inst::MirFunction &func) {
    auto check = [&](mir::inst::VarId id, int bb) {
      if (func.variables.find(id) == func.variables.end()) {
        LOG(FATAL) << "No such variable: " << id << " (in: " << func.name
                   << ", bb " << bb << ")" << std::endl;
        func.variables.insert(
            {id.id, mir::inst::Variable(mir::types::new_int_ty())});
        // failed = true;
      }
    };
    auto check_val = [&](mir::inst::Value val, int bb) {
      if (auto id = val.get_if<mir::inst::VarId>()) {
        check(*id, bb);
      }
    };
    for (auto &bb : func.basic_blks) {
      for (auto &inst : bb.second.inst) {
        auto &i = *inst;
        check(i.dest, bb.first);
        if (auto x = dynamic_cast<mir::inst::OpInst *>(&i)) {
          check_val(x->lhs, bb.first);
          check_val(x->rhs, bb.first);
        } else if (auto x = dynamic_cast<mir::inst::CallInst *>(&i)) {
          for (auto v : x->params) check_val(v, bb.first);

        } else if (auto x = dynamic_cast<mir::inst::AssignInst *>(&i)) {
          check_val(x->src, bb.first);
        } else if (auto x = dynamic_cast<mir::inst::LoadInst *>(&i)) {
          check_val(x->src, bb.first);
        } else if (auto x = dynamic_cast<mir::inst::StoreInst *>(&i)) {
          check_val(x->val, bb.first);

        } else if (auto x = dynamic_cast<mir::inst::LoadOffsetInst *>(&i)) {
          check_val(x->src, bb.first);
          check_val(x->offset, bb.first);

        } else if (auto x = dynamic_cast<mir::inst::StoreOffsetInst *>(&i)) {
          check_val(x->val, bb.first);
          check_val(x->offset, bb.first);
        } else if (auto x = dynamic_cast<mir::inst::RefInst *>(&i)) {
          if (x->val.index() == 0)
            check_val(std::get<0>(x->val), bb.first);
          else {
          }
        } else if (auto x = dynamic_cast<mir::inst::PhiInst *>(&i)) {
          for (auto v : x->vars) check(v, bb.first);
        } else if (auto x = dynamic_cast<mir::inst::PtrOffsetInst *>(&i)) {
          check_val(x->ptr, bb.first);
          check_val(x->offset, bb.first);
        } else {
          throw new std::bad_cast();
        }
      }
    }
  }